

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_loader.cpp
# Opt level: O0

string * embree::SceneGraph::stringOfTypeTag_abi_cxx11_(Tag ty)

{
  runtime_error *this;
  int in_ESI;
  string *in_RDI;
  allocator local_24;
  allocator local_23;
  allocator local_22;
  allocator local_21;
  allocator local_20;
  allocator local_1f;
  allocator local_1e;
  allocator local_1d [16];
  allocator local_d [13];
  
  if (in_ESI == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"char",local_d);
    std::allocator<char>::~allocator((allocator<char> *)local_d);
  }
  else if (in_ESI == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"uchar",local_1d);
    std::allocator<char>::~allocator((allocator<char> *)local_1d);
  }
  else if (in_ESI == 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"short",&local_1e);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e);
  }
  else if (in_ESI == 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"ushort",&local_1f);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f);
  }
  else if (in_ESI == 4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"int",&local_20);
    std::allocator<char>::~allocator((allocator<char> *)&local_20);
  }
  else if (in_ESI == 5) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"uint",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  else if (in_ESI == 6) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"float",&local_22);
    std::allocator<char>::~allocator((allocator<char> *)&local_22);
  }
  else if (in_ESI == 7) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"double",&local_23);
    std::allocator<char>::~allocator((allocator<char> *)&local_23);
  }
  else {
    if (in_ESI != 8) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"invalid type");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"list",&local_24);
    std::allocator<char>::~allocator((allocator<char> *)&local_24);
  }
  return in_RDI;
}

Assistant:

std::string stringOfTypeTag(Type::Tag ty) {
      if (ty == Type::PTY_CHAR) return "char";
      if (ty == Type::PTY_UCHAR) return "uchar";
      if (ty == Type::PTY_SHORT) return "short";
      if (ty == Type::PTY_USHORT) return "ushort";
      if (ty == Type::PTY_INT) return "int";
      if (ty == Type::PTY_UINT) return "uint";
      if (ty == Type::PTY_FLOAT) return "float";
      if (ty == Type::PTY_DOUBLE) return "double";
      if (ty == Type::PTY_LIST) return "list";
      throw std::runtime_error("invalid type");
      return "";
    }